

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_add_body_amqp_sequence(MESSAGE_HANDLE message,AMQP_VALUE sequence_list)

{
  MESSAGE_BODY_TYPE MVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE *ppAVar3;
  AMQP_VALUE pAVar4;
  size_t local_78;
  size_t local_70;
  ulong local_68;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_VALUE *new_body_amqp_sequence_items;
  LOGGER_LOG l_2;
  size_t realloc_size;
  LOGGER_LOG l_1;
  MESSAGE_BODY_TYPE body_type;
  LOGGER_LOG l;
  int result;
  AMQP_VALUE sequence_list_local;
  MESSAGE_HANDLE message_local;
  
  if ((message == (MESSAGE_HANDLE)0x0) || (sequence_list == (AMQP_VALUE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_add_body_amqp_sequence",0x4f9,1,
                "Bad arguments: message = %p, sequence_list = %p",message,sequence_list);
    }
    l._4_4_ = 0x4fa;
  }
  else {
    MVar1 = internal_get_body_type(message);
    if ((MVar1 == MESSAGE_BODY_TYPE_DATA) || (MVar1 == MESSAGE_BODY_TYPE_VALUE)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_add_body_amqp_sequence",0x503,1,
                  "Body is already set to another body type");
      }
      l._4_4_ = 0x504;
    }
    else {
      if (message->body_amqp_sequence_count < 0xfffffffffffffffe) {
        local_68 = message->body_amqp_sequence_count + 1;
      }
      else {
        local_68 = 0xffffffffffffffff;
      }
      if (local_68 == 0) {
        local_70 = 0;
      }
      else {
        if (local_68 < 0x2000000000000000) {
          local_78 = local_68 << 3;
        }
        else {
          local_78 = 0xffffffffffffffff;
        }
        local_70 = local_78;
      }
      if (local_70 == 0xffffffffffffffff) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                    ,"message_add_body_amqp_sequence",0x50d,1,
                    "Invalid size for new_body_amqp_sequence_items");
        }
        l._4_4_ = 0x50e;
      }
      else {
        ppAVar3 = (AMQP_VALUE *)realloc(message->body_amqp_sequence_items,local_70);
        if (ppAVar3 == (AMQP_VALUE *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_add_body_amqp_sequence",0x517,1,
                      "Cannot allocate enough memory for sequence items");
          }
          l._4_4_ = 0x518;
        }
        else {
          message->body_amqp_sequence_items = ppAVar3;
          pAVar4 = amqpvalue_clone(sequence_list);
          message->body_amqp_sequence_items[message->body_amqp_sequence_count] = pAVar4;
          if (message->body_amqp_sequence_items[message->body_amqp_sequence_count] ==
              (AMQP_VALUE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                        ,"message_add_body_amqp_sequence",0x524,1,"Cloning sequence failed");
            }
            l._4_4_ = 0x525;
          }
          else {
            message->body_amqp_sequence_count = message->body_amqp_sequence_count + 1;
            l._4_4_ = 0;
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

int message_add_body_amqp_sequence(MESSAGE_HANDLE message, AMQP_VALUE sequence_list)
{
    int result;

    if ((message == NULL) ||
        (sequence_list == NULL))
    {
        /* Codes_SRS_MESSAGE_01_112: [ If `message` or `sequence` is NULL, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, sequence_list = %p",
            message, sequence_list);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if ((body_type == MESSAGE_BODY_TYPE_DATA) ||
            (body_type == MESSAGE_BODY_TYPE_VALUE))
        {
            /* Codes_SRS_MESSAGE_01_115: [ If the body was already set to an AMQP data list or an AMQP value, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
            LogError("Body is already set to another body type");
            result = MU_FAILURE;
        }
        else
        {
            size_t realloc_size = safe_add_size_t(message->body_amqp_sequence_count, 1);
            realloc_size = safe_multiply_size_t(sizeof(AMQP_VALUE), realloc_size);

            if (realloc_size == SIZE_MAX)
            {
                LogError("Invalid size for new_body_amqp_sequence_items");
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE* new_body_amqp_sequence_items = (AMQP_VALUE*)realloc(message->body_amqp_sequence_items, realloc_size);

                if (new_body_amqp_sequence_items == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_158: [ If allocating memory in order to store the sequence fails, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
                    LogError("Cannot allocate enough memory for sequence items");
                    result = MU_FAILURE;
                }
                else
                {
                    message->body_amqp_sequence_items = new_body_amqp_sequence_items;

                    /* Codes_SRS_MESSAGE_01_110: [ `message_add_body_amqp_sequence` shall add the contents of `sequence` to the list of AMQP sequences for the body of the message identified by `message`. ]*/
                    /* Codes_SRS_MESSAGE_01_156: [ The AMQP sequence shall be cloned by calling `amqpvalue_clone`. ]*/
                    message->body_amqp_sequence_items[message->body_amqp_sequence_count] = amqpvalue_clone(sequence_list);
                    if (message->body_amqp_sequence_items[message->body_amqp_sequence_count] == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_157: [ If `amqpvalue_clone` fails, `message_add_body_amqp_sequence` shall fail and return a non-zero value. ]*/
                        LogError("Cloning sequence failed");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        /* Codes_SRS_MESSAGE_01_114: [ If adding the AMQP sequence fails, the previous value shall be preserved. ]*/
                        message->body_amqp_sequence_count++;

                        /* Codes_SRS_MESSAGE_01_111: [ On success it shall return 0. ]*/
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}